

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::DirectStateAccess::VertexArrays::Utilities::itoa_abi_cxx11_
          (string *__return_storage_ptr__,Utilities *this,GLuint i)

{
  stringstream ss;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1b32ab9);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Utilities::itoa(glw::GLuint i)
{
	std::string s = "";

	std::stringstream ss;

	ss << i;

	s = ss.str();

	return s;
}